

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O0

double ON_GrevilleAbcissa(int order,double *knot)

{
  double dVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double const_ord;
  double tol;
  double k1;
  double k;
  double k0;
  double g;
  double *knot_local;
  int order_local;
  
  k0 = 0.0;
  if (2 < order) {
    if ((*knot != knot[order + -2]) || (NAN(*knot) || NAN(knot[order + -2]))) {
      iVar2 = order + -1;
      dVar1 = knot[iVar2 / 2];
      dVar3 = (knot[order + -2] - *knot) * 1.490116119385e-08;
      g = (double)knot;
      knot_local._4_4_ = iVar2;
      while (knot_local._4_4_ != 0) {
        k0 = *(double *)g + k0;
        g = (double)((long)g + 8);
        knot_local._4_4_ = knot_local._4_4_ + -1;
      }
      dVar4 = k0 / (double)iVar2;
      if (dVar3 < ABS(dVar1 + dVar1 + -(*knot + knot[order + -2]))) {
        return dVar4;
      }
      if (ABS(dVar4) * 1.490116119385e-08 + dVar3 < ABS(dVar4 - dVar1)) {
        return dVar4;
      }
      return dVar1;
    }
  }
  return *knot;
}

Assistant:

double ON_GrevilleAbcissa( // get Greville abcissa
          int order,          // order (>=2)
          const double* knot  // knot[order-1] array
          )

{
  double g=0.0;
  if ( order <= 2 || knot[0] == knot[order-2]) 
  {
    g = knot[0]; // degree = 1 or fully multiple knot
  }
  else 
  {
    // g = (knot[i]+...+knot[i+degree-1])/degree
    order--;
    const double k0 = knot[0];
    const double k = knot[order/2];
    const double k1 = knot[order-1];
    const double tol = (k1-k0)*ON_SQRT_EPSILON;
    const double const_ord = (double)order;
    while ( order--) 
    {
      g += *knot++;
    }
    //g /= ((double)order);
    g /= const_ord;
    if ( fabs(2*k - (k0+k1)) <= tol && fabs(g-k) <= (fabs(g)*ON_SQRT_EPSILON+tol) )
      g = k; // sets g to exact value when knot vector is uniform
  }
  return g;
}